

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

ssize_t __thiscall libnbt::NBTTagList::read(NBTTagList *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  NBTBase *local_28;
  NBTBase *tag;
  int i;
  int32_t size;
  istream *in_local;
  NBTTagList *this_local;
  
  _i = (istream *)CONCAT44(in_register_00000034,__fd);
  in_local = (istream *)this;
  std::istream::get((char *)_i);
  tag._4_4_ = 0;
  readBytes(_i,(char *)((long)&tag + 4),'\x04');
  (*(this->super_NBTTagVector<libnbt::NBTBase_*>).super_NBTBase._vptr_NBTBase[8])();
  for (tag._0_4_ = 0; (int)(uint)tag < tag._4_4_; tag._0_4_ = (uint)tag + 1) {
    local_28 = createNewTag(this->child);
    (**local_28->_vptr_NBTBase)(local_28,_i);
    std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::push_back
              (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array,&local_28);
  }
  return (ulong)(uint)tag;
}

Assistant:

void NBTTagList::read(std::istream &in) {
        in.get(child);
        int32_t size = 0;
        readBytes(in, (char *) &size, 4);
        clear();
        for (int i = 0; i < size; i++) {
            auto *tag = createNewTag((TAG_TYPE) child);
            tag->read(in);
            array.push_back(tag);
        }
    }